

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float afVar2 [2];
  float afVar3 [2];
  float *pfVar4;
  Vector<float,_2> *pVVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Matrix<float,_2,_2> res;
  Type in1;
  Type in0;
  float local_24 [3];
  Matrix<float,_2,_2> retVal;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afVar2 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar2[0] = 1.2;
    afVar2[1] = 0.5;
  }
  in0.m_data[0] = afVar2[0];
  in0.m_data[1] = afVar2[1];
  if (in1Type == INPUTTYPE_DYNAMIC) {
    afVar3 = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    afVar3[0] = 0.5;
    afVar3[1] = 1.0;
  }
  in1.m_data[0] = afVar3[0];
  in1.m_data[1] = afVar3[1];
  pfVar4 = (float *)&retVal;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar6 != lVar7) {
        uVar9 = 0;
      }
      pfVar4[lVar7 * 2] = (float)uVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar4 = pfVar4 + 1;
    bVar8 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  pfVar4 = (float *)&retVal;
  lVar6 = 0;
  do {
    fVar1 = in1.m_data[lVar6];
    lVar7 = 0;
    do {
      pfVar4[lVar7 * 2] = in0.m_data[lVar7] * fVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar4 = pfVar4 + 1;
    bVar8 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  pfVar4 = (float *)&res;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar6 != lVar7) {
        uVar9 = 0;
      }
      pfVar4[lVar7 * 2] = (float)uVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar4 = pfVar4 + 1;
    bVar8 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  pVVar5 = (Vector<float,_2> *)&res;
  pfVar4 = (float *)&retVal;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      ((Vector<tcu::Vector<float,_2>,_2> *)pVVar5->m_data)->m_data[0].m_data[lVar7] =
           pfVar4[lVar7 * 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pVVar5 = pVVar5 + 1;
    pfVar4 = pfVar4 + 1;
    bVar8 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar8);
  retVal.m_data.m_data[0].m_data = (float  [2])&evalCtx->color;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 1.4013e-45;
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[(int)retVal.m_data.m_data[0].m_data[lVar6]] = in0.m_data[lVar6 + 1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}